

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

void __thiscall covenant::CFG::stats(CFG *this,ostream *o)

{
  pointer pvVar1;
  ostream *poVar2;
  pointer *ppPVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"Number of terminals        : ",0x1d);
  poVar2 = (ostream *)std::ostream::operator<<(o,this->alphsz);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(o,"Number of non-terminals    : ",0x1d);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pvVar1 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->prods).
                super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar4 == 0) {
    uVar7 = 0;
  }
  else {
    uVar5 = (lVar4 >> 3) * -0x5555555555555555;
    ppPVar3 = (pointer *)
              ((long)&(pvVar1->
                      super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                      )._M_impl.super__Vector_impl_data + 8);
    uVar7 = 0;
    uVar6 = 1;
    uVar8 = 0;
    do {
      uVar9 = (uint)((ulong)((long)*ppPVar3 - (long)((_Vector_impl_data *)(ppPVar3 + -1))->_M_start)
                    >> 2);
      uVar7 = uVar7 + uVar9;
      if (uVar9 < uVar8) {
        uVar9 = uVar8;
      }
      uVar8 = uVar9;
      uVar10 = (ulong)uVar6;
      ppPVar3 = ppPVar3 + 3;
      uVar6 = uVar6 + 1;
    } while (uVar10 <= uVar5 && uVar5 - uVar10 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"Total number of productions: ",0x1d);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              (o,"Avg number of productions per non-terminal : ",0x2d);
    poVar2 = std::ostream::_M_insert<double>
                       ((double)((float)uVar7 /
                                (float)(ulong)(((long)(this->prods).
                                                                                                            
                                                  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->prods).
                                                                                                            
                                                  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                              -0x5555555555555555)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (o,"Max number of productions per non-terminal : ",0x2d);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    return;
  }
  return;
}

Assistant:

void stats(ostream &o) const
    {
      o << "Number of terminals        : " << alphsz << "\n";
      o << "Number of non-terminals    : " << prods.size () << "\n";

      unsigned total_productions=0;
      unsigned max_per_nonterminal=0;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        total_productions += prods[vv].size();
        max_per_nonterminal = std::max(max_per_nonterminal, 
                                       (unsigned) prods[vv].size ());
      }

      o << "Total number of productions: " << total_productions << "\n";
      if (prods.size() > 0)
      {
        o << "Avg number of productions per non-terminal : " 
          << float(total_productions) / float(prods.size ()) << "\n";
        o << "Max number of productions per non-terminal : " 
          << max_per_nonterminal << "\n";
      }
    }